

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceSelector.hpp
# Opt level: O3

void __thiscall
AO::BehaviorTree::Version_1::Details::SequenceSelector<Agent,_short>::initialize
          (SequenceSelector<Agent,_short> *this,EntityPtr entity)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_> *child;
  pointer psVar3;
  
  this->currentPosition = 0xffffffffffffffff;
  psVar1 = (this->super_CompositeNode<Agent,_short>).children.
           super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->super_CompositeNode<Agent,_short>).children.
                super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->
             super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    (*(peVar2->super_RootNode<Agent,_short>)._vptr_RootNode[2])(peVar2,entity);
  }
  return;
}

Assistant:

void initialize(EntityPtr entity) override final
					{
						currentPosition = InitialPosition;
						for (auto &child : this->children)
						{
							child->initialize(entity);
						}
					}